

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O3

int __thiscall deqp::egl::Image::ModifyTests::init(ModifyTests *this,EVP_PKEY_CTX *ctx)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  ImageFormatCase *this_00;
  long *plVar5;
  ulong uVar6;
  LabeledAction *pLVar7;
  long lVar8;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> *pMVar9;
  TestSpec spec;
  Operation local_100;
  long local_f0;
  long lStack_e8;
  TestSpec local_e0;
  RenderTryAll *local_70;
  long *local_68 [2];
  long local_58 [2];
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> *local_48;
  LabeledActions *local_40;
  long local_38;
  
  local_e0.name._M_dataplus._M_p = (pointer)&local_e0.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"tex_","");
  ImageTests::addCreateTexture2DActions(&this->super_ImageTests,&local_e0.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.name._M_dataplus._M_p != &local_e0.name.field_2) {
    operator_delete(local_e0.name._M_dataplus._M_p,
                    CONCAT71(local_e0.name.field_2._M_allocated_capacity._1_7_,
                             local_e0.name.field_2._M_local_buf[0]) + 1);
  }
  ImageTests::addCreateRenderbufferActions(&this->super_ImageTests);
  ImageTests::addCreateAndroidNativeActions(&this->super_ImageTests);
  addModifyActions(this);
  iVar3 = (this->super_ImageTests).m_createActions.m_numActions;
  if (0 < iVar3) {
    local_40 = &(this->super_ImageTests).m_createActions;
    local_70 = &this->m_renderAction;
    uVar6 = (ulong)(uint)(this->m_modifyActions).m_numActions;
    local_48 = &(this->m_modifyActions).m_actions[0].action;
    local_38 = 0;
    do {
      if (0 < (int)uVar6) {
        pLVar7 = local_40->m_actions + local_38;
        lVar8 = 0;
        pMVar9 = local_48;
        do {
          bVar2 = isCompatibleCreateAndModifyActions
                            ((pLVar7->action).
                             super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                             .m_data.ptr,
                             (pMVar9->
                             super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                             ).m_data.ptr);
          if (bVar2) {
            local_e0.name._M_dataplus._M_p = (pointer)&local_e0.name.field_2;
            local_e0.name._M_string_length = 0;
            local_e0.name.field_2._M_local_buf[0] = '\0';
            local_e0.desc._M_dataplus._M_p = (pointer)&local_e0.desc.field_2;
            local_e0.desc._M_string_length = 0;
            local_e0.desc.field_2._M_local_buf[0] = '\0';
            local_e0.operations.
            super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
            ._M_impl.super__Vector_impl_data._M_finish = (Operation *)0x0;
            local_e0.operations.
            super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (Operation *)0x0;
            local_e0.contexts.
            super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (ApiContext *)0x0;
            local_e0.operations.
            super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_e0.contexts.
            super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_e0.contexts.
            super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
            ._M_impl.super__Vector_impl_data._M_finish = (ApiContext *)0x0;
            local_68[0] = local_58;
            pcVar1 = (pLVar7->label)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_68,pcVar1,pcVar1 + (pLVar7->label)._M_string_length);
            std::__cxx11::string::append((char *)local_68);
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_68,
                                        (ulong)(((LabeledAction *)(pMVar9 + -2))->label)._M_dataplus
                                               ._M_p);
            plVar5 = plVar4 + 2;
            if ((long *)*plVar4 == plVar5) {
              local_f0 = *plVar5;
              lStack_e8 = plVar4[3];
              local_100._0_8_ = &local_f0;
            }
            else {
              local_f0 = *plVar5;
              local_100._0_8_ = (long *)*plVar4;
            }
            local_100.action = (Action *)plVar4[1];
            *plVar4 = (long)plVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_100);
            if ((long *)local_100._0_8_ != &local_f0) {
              operator_delete((void *)local_100._0_8_,local_f0 + 1);
            }
            if (local_68[0] != local_58) {
              operator_delete(local_68[0],local_58[0] + 1);
            }
            std::__cxx11::string::_M_replace
                      ((ulong)&local_e0.desc,0,(char *)local_e0.desc._M_string_length,0x361a5e);
            local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
            if (local_e0.contexts.
                super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_e0.contexts.
                super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
              ::_M_realloc_insert<deqp::egl::Image::TestSpec::ApiContext>
                        (&local_e0.contexts,
                         (iterator)
                         local_e0.contexts.
                         super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(ApiContext *)&local_100);
            }
            else {
              *local_e0.contexts.
               super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
               ._M_impl.super__Vector_impl_data._M_finish = API_GLES2;
              local_e0.contexts.
              super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_e0.contexts.
                   super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_100.action =
                 (pLVar7->action).
                 super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                 .m_data.ptr;
            local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
            if (local_e0.operations.
                super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_e0.operations.
                super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
              ::_M_realloc_insert<deqp::egl::Image::TestSpec::Operation>
                        (&local_e0.operations,
                         (iterator)
                         local_e0.operations.
                         super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_100);
            }
            else {
              (local_e0.operations.
               super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
               ._M_impl.super__Vector_impl_data._M_finish)->apiIndex = local_100.apiIndex;
              *(undefined4 *)
               &(local_e0.operations.
                 super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_100._4_4_;
              (local_e0.operations.
               super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
               ._M_impl.super__Vector_impl_data._M_finish)->action = local_100.action;
              local_e0.operations.
              super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_e0.operations.
                   super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
            local_100.action = (Action *)local_70;
            if (local_e0.operations.
                super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_e0.operations.
                super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
              ::_M_realloc_insert<deqp::egl::Image::TestSpec::Operation>
                        (&local_e0.operations,
                         (iterator)
                         local_e0.operations.
                         super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_100);
            }
            else {
              (local_e0.operations.
               super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
               ._M_impl.super__Vector_impl_data._M_finish)->apiIndex = local_100.apiIndex;
              *(undefined4 *)
               &(local_e0.operations.
                 super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_100._4_4_;
              (local_e0.operations.
               super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
               ._M_impl.super__Vector_impl_data._M_finish)->action = (Action *)local_70;
              local_e0.operations.
              super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_e0.operations.
                   super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_100.action =
                 (pMVar9->
                 super_UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                 ).m_data.ptr;
            local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
            if (local_e0.operations.
                super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_e0.operations.
                super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
              ::_M_realloc_insert<deqp::egl::Image::TestSpec::Operation>
                        (&local_e0.operations,
                         (iterator)
                         local_e0.operations.
                         super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_100);
            }
            else {
              (local_e0.operations.
               super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
               ._M_impl.super__Vector_impl_data._M_finish)->apiIndex = local_100.apiIndex;
              *(undefined4 *)
               &(local_e0.operations.
                 super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_100._4_4_;
              (local_e0.operations.
               super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
               ._M_impl.super__Vector_impl_data._M_finish)->action = local_100.action;
              local_e0.operations.
              super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_e0.operations.
                   super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
            local_100.action = (Action *)local_70;
            if (local_e0.operations.
                super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_e0.operations.
                super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
              ::_M_realloc_insert<deqp::egl::Image::TestSpec::Operation>
                        (&local_e0.operations,
                         (iterator)
                         local_e0.operations.
                         super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_100);
            }
            else {
              (local_e0.operations.
               super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
               ._M_impl.super__Vector_impl_data._M_finish)->apiIndex = local_100.apiIndex;
              *(undefined4 *)
               &(local_e0.operations.
                 super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_100._4_4_;
              (local_e0.operations.
               super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
               ._M_impl.super__Vector_impl_data._M_finish)->action = (Action *)local_70;
              local_e0.operations.
              super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_e0.operations.
                   super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            this_00 = (ImageFormatCase *)operator_new(0x1bc8);
            ImageFormatCase::ImageFormatCase
                      (this_00,(this->super_ImageTests).super_TestCaseGroup.m_eglTestCtx,&local_e0);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
            if (local_e0.operations.
                super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e0.operations.
                              super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_e0.operations.
                                    super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e0.operations.
                                    super__Vector_base<deqp::egl::Image::TestSpec::Operation,_std::allocator<deqp::egl::Image::TestSpec::Operation>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e0.contexts.
                super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e0.contexts.
                              super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_e0.contexts.
                                    super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e0.contexts.
                                    super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0.desc._M_dataplus._M_p != &local_e0.desc.field_2) {
              operator_delete(local_e0.desc._M_dataplus._M_p,
                              CONCAT71(local_e0.desc.field_2._M_allocated_capacity._1_7_,
                                       local_e0.desc.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0.name._M_dataplus._M_p != &local_e0.name.field_2) {
              operator_delete(local_e0.name._M_dataplus._M_p,
                              CONCAT71(local_e0.name.field_2._M_allocated_capacity._1_7_,
                                       local_e0.name.field_2._M_local_buf[0]) + 1);
            }
          }
          lVar8 = lVar8 + 1;
          uVar6 = (ulong)(this->m_modifyActions).m_numActions;
          pMVar9 = pMVar9 + 3;
        } while (lVar8 < (long)uVar6);
        iVar3 = (this->super_ImageTests).m_createActions.m_numActions;
      }
      local_38 = local_38 + 1;
    } while (local_38 < iVar3);
  }
  return iVar3;
}

Assistant:

void ModifyTests::init (void)
{
	addCreateTexture2DActions("tex_");
	addCreateRenderbufferActions();
	addCreateAndroidNativeActions();
	addModifyActions();

	for (int createNdx = 0; createNdx < m_createActions.size(); createNdx++)
	{
		LabeledAction& createAction = m_createActions[createNdx];

		for (int modifyNdx = 0; modifyNdx < m_modifyActions.size(); modifyNdx++)
		{
			LabeledAction& modifyAction = m_modifyActions[modifyNdx];

			if (!isCompatibleCreateAndModifyActions(*createAction.action, *modifyAction.action))
				continue;

			TestSpec spec;
			spec.name = createAction.label + "_" + modifyAction.label;
			spec.desc = "gles2_tex_sub_image";

			spec.contexts.push_back(TestSpec::API_GLES2);

			spec.operations.push_back(TestSpec::Operation(0, *createAction.action));
			spec.operations.push_back(TestSpec::Operation(0, m_renderAction));
			spec.operations.push_back(TestSpec::Operation(0, *modifyAction.action));
			spec.operations.push_back(TestSpec::Operation(0, m_renderAction));

			addChild(new ImageFormatCase(m_eglTestCtx, spec));
		}
	}
}